

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

bool __thiscall
soplex::SPxSolverBase<double>::enter(SPxSolverBase<double> *this,SPxId *enterId,bool polish)

{
  SSVectorBase<double> *pSVar1;
  SSVectorBase<double> *pSVar2;
  SLinSolver<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  Item *pIVar6;
  SVectorBase<double> *pSVar7;
  bool bVar8;
  Real RVar9;
  double dVar10;
  LPRowSetBase<double> *pLVar11;
  int iVar12;
  uint uVar13;
  undefined4 extraout_var;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  _func_int **pp_Var17;
  SPxOut *pSVar18;
  SVectorBase<double> *pSVar19;
  ulong uVar20;
  undefined7 in_register_00000011;
  int *piVar21;
  DataKey *pDVar22;
  double dVar23;
  SSVectorBase<double> *pSVar24;
  DataKey DVar25;
  ulong uVar26;
  SSVectorBase<double> *pSVar27;
  SSVectorBase<double> *pSVar28;
  pointer pUVar29;
  ulong uVar30;
  UpdateVector<double> *pUVar31;
  undefined4 uVar32;
  Status enterStat;
  SVectorBase<double> *local_118;
  undefined8 uStack_110;
  double leavebound;
  double local_f8;
  undefined8 uStack_f0;
  DataKey *local_e8;
  double enterTest;
  double leaveVal;
  undefined4 local_cc;
  ulong local_c8;
  SPxId none;
  double enterMax;
  double enterVal;
  StableSum<double> objChange;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  SSVectorBase<double> *local_70;
  double enterRO;
  double enterLB;
  double enterUB;
  
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  objChange.sum = 0.0;
  objChange.c = 0.0;
  iVar12 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
             super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])();
  local_118 = (SVectorBase<double> *)CONCAT44(extraout_var,iVar12);
  local_c8 = CONCAT71(local_c8._1_7_,this->instableEnter);
  local_e8 = &enterId->super_DataKey;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_90,
             &enterStat,&enterRO,&objChange);
  if ((int)CONCAT71(in_register_00000011,polish) == 0) {
    local_f8 = enterTest;
    RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (local_f8 <= -RVar9) goto LAB_001f2c5d;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (SUB84(enterTest,0),this,*local_e8,(ulong)(uint)enterStat);
    pp_Var17 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
    dVar23 = 0.0;
LAB_001f3120:
    uVar26 = 0xffffffff;
    pSVar19 = (SVectorBase<double> *)0x0;
    pSVar27 = (SSVectorBase<double> *)0x0;
    pDVar22 = &none.super_DataKey;
  }
  else {
LAB_001f2c5d:
    pUVar31 = this->theFvec;
    if (((pUVar31->thedelta).setupStatus == true) && ((pUVar31->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<double>::solve4update
                (&this->super_SPxBasisBase<double>,&pUVar31->thedelta,local_118);
    }
    if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[(ulong)(enterMax < 0.0) + 0x89])
                (this);
    }
    leaveVal = -enterMax;
    this->boundflips = 0;
    uVar13 = (*this->theratiotester->_vptr_SPxRatioTester[7])
                       (SUB84(enterTest,0),this->theratiotester,&leaveVal,polish);
    this->instableEnterVal = 0.0;
    (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this->instableEnter = false;
    dVar23 = (double)CONCAT71((int7)((ulong)&enterMax >> 8),(int)uVar13 >= 0);
    if ((int)uVar13 < 0) {
      local_f8 = leaveVal + enterMax;
      uStack_f0 = 0;
      RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      if (ABS(local_f8) <= RVar9) {
        if (!polish) {
          local_f8 = leaveVal;
          ::soplex::infinity::__tls_init();
          pdVar16 = (double *)__tls_get_addr(&PTR_003b4b70);
          if (local_f8 < *pdVar16) {
            local_f8 = leaveVal;
            uStack_80 = 0;
            local_88 = *pdVar16;
            ::soplex::infinity::__tls_init();
            pDVar22 = local_e8;
            pSVar19 = local_118;
            if (-local_88 < local_f8) {
              (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                        (&this->super_SPxBasisBase<double>,0xffffffff,local_e8,local_118,0);
              pUVar31 = this->theFvec;
              pUVar31->theval = leaveVal;
              UpdateVector<double>::update(pUVar31);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x83])
                        (SUB84(leaveVal,0),this,*pDVar22,(ulong)(uint)enterStat,pSVar19,&objChange);
              if (this->m_nonbasicValueUpToDate == true) {
                this->m_nonbasicValue = objChange.sum + objChange.c + this->m_nonbasicValue;
                nonbasicValue(this);
              }
              goto LAB_001f360b;
            }
          }
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
                  (SUB84(enterTest,0),this,*local_e8,(ulong)(uint)enterStat);
        (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (&this->super_SPxBasisBase<double>,0xffffffff,&none,0,0);
        if (!polish) {
          if ((this->super_SPxBasisBase<double>).updateCount < 2) {
            local_118 = (SVectorBase<double> *)ABS(enterTest);
            uStack_110 = 0;
            dVar10 = entertol(this);
            pSVar18 = this->spxout;
            if (dVar10 <= (double)local_118) {
              if ((pSVar18 != (SPxOut *)0x0) && (4 < (int)pSVar18->m_verbosity)) {
                local_cc = 5;
                leavebound._0_4_ = pSVar18->m_verbosity;
                (*pSVar18->_vptr_SPxOut[2])();
                pSVar18 = operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
                pSVar18 = operator<<(pSVar18,"enter()");
                std::endl<char,std::char_traits<char>>(pSVar18->m_streams[pSVar18->m_verbosity]);
                (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
              }
              if (this->theRep == ROW) {
                computeDualfarkas4Row(this,leaveVal,(SPxId)*local_e8);
                if (this->m_status == OPTIMAL) {
                  this->m_status = UNKNOWN;
                }
                if ((this->super_SPxBasisBase<double>).thestatus != INFEASIBLE) {
                  (this->super_SPxBasisBase<double>).thestatus = INFEASIBLE;
                }
              }
              else {
                computePrimalray4Col(this,leaveVal,(SPxId)*local_e8);
                if (this->m_status == OPTIMAL) {
                  this->m_status = UNKNOWN;
                }
                if ((this->super_SPxBasisBase<double>).thestatus != UNBOUNDED) {
                  (this->super_SPxBasisBase<double>).thestatus = UNBOUNDED;
                }
              }
            }
            else {
              if ((pSVar18 != (SPxOut *)0x0) && (4 < (int)pSVar18->m_verbosity)) {
                local_cc = 5;
                leavebound._0_4_ = pSVar18->m_verbosity;
                (*pSVar18->_vptr_SPxOut[2])();
                pSVar18 = operator<<(this->spxout,
                                     "IENTER11 clean up step to reduce numerical errors");
                std::endl<char,std::char_traits<char>>(pSVar18->m_streams[pSVar18->m_verbosity]);
                (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
              }
              SPxBasisBase<double>::coSolve
                        (&this->super_SPxBasisBase<double>,
                         &this->theCoPvec->super_VectorBase<double>,this->theCoPrhs);
              computePvec(this);
              computeCoTest(this);
              computeTest(this);
            }
          }
          else {
            pSVar18 = this->spxout;
            if ((pSVar18 != (SPxOut *)0x0) && (4 < (int)pSVar18->m_verbosity)) {
              local_cc = 5;
              leavebound._0_4_ = pSVar18->m_verbosity;
              (*pSVar18->_vptr_SPxOut[2])();
              pSVar18 = operator<<(this->spxout,"IENTER01 factorization triggered in ");
              pSVar18 = operator<<(pSVar18,"enter() for feasibility test");
              std::endl<char,std::char_traits<char>>(pSVar18->m_streams[pSVar18->m_verbosity]);
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
            }
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
          }
        }
        goto LAB_001f360b;
      }
      DVar25 = *local_e8;
      if ((char)local_c8 == '\0') {
        (this->instableEnterId).super_DataKey = DVar25;
        this->instableEnterVal = enterTest;
        DVar25 = *local_e8;
        uVar32 = SUB84(enterTest / 10.0,0);
      }
      else {
        uVar32 = SUB84(enterTest,0);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
                (uVar32,this,DVar25,(ulong)(uint)enterStat);
      pp_Var17 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
      goto LAB_001f3120;
    }
    local_f8 = ABS(leaveVal);
    uStack_f0 = 0;
    dVar10 = entertol(this);
    uVar26 = (ulong)uVar13;
    if (dVar10 <= local_f8) {
      this->m_numCycle = this->m_numCycle / 2;
    }
    else {
      local_f8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar26] -
                 (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar26];
      uStack_f0 = 0;
      RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      if (((RVar9 < ABS(local_f8)) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
        this->m_numCycle = this->m_numCycle + 1;
        this->enterCycles = this->enterCycles + 1;
      }
    }
    pSVar27 = this->coSolveVector2;
    pSVar1 = this->coSolveVector3;
    local_88 = (double)CONCAT44(local_88._4_4_,uVar13);
    if (pSVar1 == (SSVectorBase<double> *)0x0) {
      if (pSVar27 == (SSVectorBase<double> *)0x0) {
        SPxBasisBase<double>::coSolve
                  (&this->super_SPxBasisBase<double>,&this->theCoPvec->thedelta,
                   &(this->unitVecs).data.
                    super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar26].super_SVectorBase<double>);
      }
      else {
        pUVar31 = this->theCoPvec;
        pSVar1 = this->coSolveVector2rhs;
        pUVar29 = (this->unitVecs).data.
                  super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_f8 = dVar23;
        if ((this->super_SPxBasisBase<double>).factorized == false) {
          SPxBasisBase<double>::factorize(&this->super_SPxBasisBase<double>);
        }
        pSVar3 = (this->super_SPxBasisBase<double>).factor;
        (*pSVar3->_vptr_SLinSolver[0x18])(pSVar3,&pUVar31->thedelta,pSVar27,pUVar29 + uVar26,pSVar1)
        ;
        dVar23 = local_f8;
      }
    }
    else {
      pSVar24 = &this->theCoPvec->thedelta;
      pUVar29 = (this->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar26;
      local_c8 = uVar26;
      if (pSVar27 == (SSVectorBase<double> *)0x0) {
        pSVar27 = this->coSolveVector3rhs;
        local_f8 = dVar23;
        if ((this->super_SPxBasisBase<double>).factorized == false) {
          SPxBasisBase<double>::factorize(&this->super_SPxBasisBase<double>);
        }
        pSVar3 = (this->super_SPxBasisBase<double>).factor;
        (*pSVar3->_vptr_SLinSolver[0x18])(pSVar3,pSVar24,pSVar1,pUVar29,pSVar27);
        pSVar27 = this->coSolveVector3;
        pUVar31 = this->theCoPvec;
        dVar23 = local_f8;
        uVar26 = local_c8;
        if (pSVar27->setupStatus == true) {
          lVar14 = (long)(pSVar27->super_IdxSet).num;
          if (0 < lVar14) {
            piVar21 = (pSVar27->super_IdxSet).idx;
            pdVar4 = (pSVar27->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (pUVar31->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = lVar14 + 1;
            do {
              iVar12 = piVar21[uVar15 - 2];
              pdVar5[iVar12] = pdVar5[iVar12] - pdVar4[iVar12];
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
        }
        else {
          pdVar4 = (pUVar31->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = (uint)((ulong)((long)(pUVar31->super_VectorBase<double>).val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pdVar4) >> 3);
          if (0 < (int)uVar13) {
            pdVar5 = (pSVar27->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = (ulong)(uVar13 & 0x7fffffff) + 1;
            do {
              pdVar4[uVar15 + 0xfffffffffffffffe] =
                   pdVar4[uVar15 + 0xfffffffffffffffe] - pdVar5[uVar15 - 2];
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
        }
      }
      else {
        pSVar2 = this->coSolveVector2rhs;
        pSVar28 = this->coSolveVector3rhs;
        local_f8 = dVar23;
        if ((this->super_SPxBasisBase<double>).factorized == false) {
          local_70 = this->coSolveVector3rhs;
          SPxBasisBase<double>::factorize(&this->super_SPxBasisBase<double>);
          pSVar28 = local_70;
        }
        pSVar3 = (this->super_SPxBasisBase<double>).factor;
        (*pSVar3->_vptr_SLinSolver[0x1a])(pSVar3,pSVar24,pSVar27,pSVar1,pUVar29,pSVar2,pSVar28);
        pSVar27 = this->coSolveVector3;
        pUVar31 = this->theCoPvec;
        dVar23 = local_f8;
        uVar26 = local_c8;
        if (pSVar27->setupStatus == true) {
          lVar14 = (long)(pSVar27->super_IdxSet).num;
          if (0 < lVar14) {
            piVar21 = (pSVar27->super_IdxSet).idx;
            pdVar4 = (pSVar27->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (pUVar31->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = lVar14 + 1;
            do {
              iVar12 = piVar21[uVar15 - 2];
              pdVar5[iVar12] = pdVar5[iVar12] - pdVar4[iVar12];
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
        }
        else {
          pdVar4 = (pUVar31->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = (uint)((ulong)((long)(pUVar31->super_VectorBase<double>).val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pdVar4) >> 3);
          if (0 < (int)uVar13) {
            pdVar5 = (pSVar27->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = (ulong)(uVar13 & 0x7fffffff) + 1;
            do {
              pdVar4[uVar15 + 0xfffffffffffffffe] =
                   pdVar4[uVar15 + 0xfffffffffffffffe] - pdVar5[uVar15 - 2];
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
        }
      }
    }
    pSVar19 = local_118;
    if (0 < this->boundflips) {
      uVar13 = (uint)((ulong)((long)(this->coSolveVector3->super_VectorBase<double>).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(this->coSolveVector3->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar13) {
        uVar15 = (ulong)(uVar13 & 0x7fffffff);
        do {
          uVar30 = uVar15 - 1;
          local_118 = (SVectorBase<double> *)
                      ((ulong)(this->coSolveVector3->super_VectorBase<double>).val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar15 - 1] & 0x7fffffffffffffff);
          uStack_110 = 0;
          RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
          if (RVar9 < (double)local_118) {
            pIVar6 = (this->thecovectors->set).theitem;
            iVar12 = (this->thecovectors->set).thekey[uVar30].idx;
            lVar14 = (long)pIVar6[iVar12].data.super_SVectorBase<double>.memused;
            if (0 < lVar14) {
              dVar10 = (this->coSolveVector3->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar30];
              pdVar4 = (this->thePvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar20 = lVar14 + 1;
              piVar21 = &pIVar6[iVar12].data.super_SVectorBase<double>.m_elem[lVar14 + -1].idx;
              do {
                pdVar4[*piVar21] =
                     pdVar4[*piVar21] - ((Nonzero<double> *)(piVar21 + -2))->val * dVar10;
                uVar20 = uVar20 - 1;
                piVar21 = piVar21 + -4;
              } while (1 < uVar20);
            }
          }
          bVar8 = 1 < (long)uVar15;
          uVar15 = uVar30;
        } while (bVar8);
      }
      if (local_e8->info < 1) {
        pUVar31 = this->thePvec;
        SPxRowId::SPxRowId((SPxRowId *)&leavebound,(SPxId *)local_e8);
        pLVar11 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>;
      }
      else {
        pUVar31 = this->theCoPvec;
        SPxColId::SPxColId((SPxColId *)&leavebound,(SPxId *)local_e8);
        pLVar11 = (LPRowSetBase<double> *)
                  &(this->super_SPxLPBase<double>).super_LPColSetBase<double>;
      }
      iVar12 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                         (&(pLVar11->super_SVSetBase<double>).set,(DataKey *)&leavebound);
      local_90 = (pUVar31->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[iVar12];
      this->totalboundflips = this->totalboundflips + this->boundflips;
    }
    (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar26] = enterRO;
    local_118 = (SVectorBase<double> *)
                ((enterRO - local_90) /
                (this->theFvec->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar26]);
    this->theCoPvec->theval = (double)local_118;
    RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (RVar9 < (double)local_118) {
LAB_001f3396:
      if (this->thePricing == FULL) {
        this->thePvec->theval = this->theCoPvec->theval;
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])(this);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
    }
    else {
      local_118 = (SVectorBase<double> *)this->theCoPvec->theval;
      RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      if ((double)local_118 < -RVar9) goto LAB_001f3396;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x82])
              (enterMax._0_4_,this,(ulong)local_88 & 0xffffffff,&leavebound,&objChange);
    (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar26] = enterUB;
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar26] = enterLB;
    updateCoTest(this);
    if (this->thePricing == FULL) {
      updateTest(this);
    }
    pUVar31 = this->theFvec;
    pUVar31->theval = leaveVal;
    UpdateVector<double>::update(pUVar31);
    (this->theFvec->super_VectorBase<double>).val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar26] = enterVal - leaveVal;
    local_118 = (SVectorBase<double> *)CONCAT44(leavebound._4_4_,leavebound._0_4_);
    RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (RVar9 < (double)local_118) {
LAB_001f34b9:
      pSVar7 = (this->super_SPxBasisBase<double>).matrix.data[uVar26];
      lVar14 = (long)pSVar7->memused;
      if (0 < lVar14) {
        pdVar4 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = lVar14 + 1;
        piVar21 = &pSVar7->m_elem[lVar14 + -1].idx;
        do {
          pdVar4[*piVar21] =
               pdVar4[*piVar21] -
               ((Nonzero<double> *)(piVar21 + -2))->val *
               (double)CONCAT44(leavebound._4_4_,leavebound._0_4_);
          uVar26 = uVar26 - 1;
          piVar21 = piVar21 + -4;
        } while (1 < uVar26);
      }
    }
    else {
      local_118 = (SVectorBase<double> *)CONCAT44(leavebound._4_4_,leavebound._0_4_);
      RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      if ((double)local_118 < -RVar9) goto LAB_001f34b9;
    }
    local_118 = (SVectorBase<double> *)enterVal;
    RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (RVar9 < (double)local_118) {
LAB_001f3562:
      lVar14 = (long)pSVar19->memused;
      if (0 < lVar14) {
        pdVar4 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = lVar14 + 1;
        piVar21 = &pSVar19->m_elem[lVar14 + -1].idx;
        do {
          pdVar4[*piVar21] = enterVal * ((Nonzero<double> *)(piVar21 + -2))->val + pdVar4[*piVar21];
          uVar26 = uVar26 - 1;
          piVar21 = piVar21 + -4;
        } while (1 < uVar26);
      }
    }
    else {
      local_118 = (SVectorBase<double> *)enterVal;
      RVar9 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      if ((double)local_118 < -RVar9) goto LAB_001f3562;
    }
    if (this->m_nonbasicValueUpToDate == true) {
      this->m_nonbasicValue = objChange.sum + objChange.c + this->m_nonbasicValue;
      nonbasicValue(this);
    }
    pSVar27 = &this->theFvec->thedelta;
    pp_Var17 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
    uVar26 = (ulong)local_88 & 0xffffffff;
    pDVar22 = local_e8;
  }
  (**pp_Var17)(&this->super_SPxBasisBase<double>,uVar26,pDVar22,pSVar19,pSVar27);
LAB_001f360b:
  return (bool)SUB81(dVar23,0);
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}